

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

void si9ma::SinglyLinkedList::print_list(SinglyNodeWithRand *head,string *separator)

{
  ostream *poVar1;
  string *separator_local;
  SinglyNodeWithRand *head_local;
  
  for (separator_local = (string *)head; separator_local != (string *)0x0;
      separator_local = (string *)(separator_local->super__Hash_node_base)._M_nxt) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *(int *)((long)&(separator_local->
                                        super__Hash_node_value<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_storage._M_storage + 8));
    std::operator<<(poVar1,(string *)separator);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SinglyLinkedList::print_list(SinglyNodeWithRand *head,string separator) {
        while (head != nullptr){
            std::cout << head->value << separator;
            head = head->next;
        }

        std::cout << std::endl;
    }